

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest_InvalidIdentifierNotOid_Test>
::CreateTest(ParameterizedTestFactory<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest_InvalidIdentifierNotOid_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest::
  ParseCertificatePoliciesExtensionOidsTest((ParseCertificatePoliciesExtensionOidsTest *)this_00);
  (((TestWithParam<bool> *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestWithParam_0058ffb8;
  this_00[1]._vptr_Test =
       (_func_int **)
       &PTR__ParseCertificatePoliciesExtensionOidsTest_InvalidIdentifierNotOid_Test_0058fff8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }